

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O0

rhash rhash_init(uint hash_id)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  rhash_hash_info *prVar6;
  uint *local_58;
  char *phash_ctx;
  size_t aligned_size;
  rhash_hash_info *info;
  uint local_38;
  uint id;
  uint bit_index;
  uint i;
  size_t hash_size_sum;
  rhash_context_ext *rctx;
  uint num;
  uint tail_bit_index;
  uint hash_id_local;
  
  rctx._4_4_ = 0;
  _bit_index = 0;
  uVar3 = hash_id & 0x3ff;
  if (uVar3 == 0) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    _tail_bit_index = (rhash)0x0;
  }
  else {
    uVar1 = 0;
    for (uVar2 = uVar3; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x80000000) {
      uVar1 = uVar1 + 1;
    }
    if (9 < uVar1) {
      __assert_fail("tail_bit_index < RHASH_HASH_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                    ,100,"rhash rhash_init(unsigned int)");
    }
    info._4_4_ = 1 << ((byte)uVar1 & 0x1f);
    local_38 = uVar1;
    if (uVar3 == info._4_4_) {
      rctx._4_4_ = 1;
      _bit_index = rhash_info_table[uVar1].context_size;
    }
    else {
      for (; info._4_4_ <= uVar3; info._4_4_ = info._4_4_ << 1) {
        if (info._4_4_ == 0) {
          __assert_fail("id != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                        ,0x70,"rhash rhash_init(unsigned int)");
        }
        if (9 < local_38) {
          __assert_fail("bit_index < RHASH_HASH_COUNT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                        ,0x71,"rhash rhash_init(unsigned int)");
        }
        if ((uVar3 & info._4_4_) != 0) {
          _bit_index = (rhash_info_table[local_38].context_size + 7 & 0xfffffffffffffff8) +
                       _bit_index;
          rctx._4_4_ = rctx._4_4_ + 1;
        }
        local_38 = local_38 + 1;
      }
      if (rctx._4_4_ < 2) {
        __assert_fail("num > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                      ,0x7a,"rhash rhash_init(unsigned int)");
      }
    }
    uVar5 = (ulong)rctx._4_4_ * 0x10 + 0x38;
    if (uVar5 < 0x48) {
      __assert_fail("aligned_size >= sizeof(rhash_context_ext)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                    ,0x7f,"rhash rhash_init(unsigned int)");
    }
    _tail_bit_index = (rhash)malloc(uVar5 + _bit_index);
    if (_tail_bit_index == (rhash)0x0) {
      _tail_bit_index = (rhash)0x0;
    }
    else {
      memset(_tail_bit_index,0,0x48);
      _tail_bit_index->hash_id = uVar3;
      *(undefined4 *)((long)&_tail_bit_index[1].msg_size + 4) = 1;
      _tail_bit_index[1].hash_id = 0xb01dbabe;
      *(uint *)&_tail_bit_index[1].msg_size = rctx._4_4_;
      local_58 = &_tail_bit_index[(ulong)rctx._4_4_ + 3].hash_id;
      if (local_58 < &_tail_bit_index[(ulong)rctx._4_4_ + 3].hash_id) {
        __assert_fail("phash_ctx >= (char*)&rctx->vector[num]",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                      ,0x8e,"rhash rhash_init(unsigned int)");
      }
      id = 0;
      local_38 = uVar1;
      for (info._4_4_ = 1 << ((byte)uVar1 & 0x1f); info._4_4_ <= uVar3; info._4_4_ = info._4_4_ << 1
          ) {
        if ((uVar3 & info._4_4_) != 0) {
          prVar6 = rhash_info_table + local_38;
          if (prVar6->context_size == 0) {
            __assert_fail("info->context_size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                          ,0x97,"rhash rhash_init(unsigned int)");
          }
          if (((ulong)local_58 & 7) != 0) {
            __assert_fail("((phash_ctx - (char*)0) & 7) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                          ,0x98,"rhash rhash_init(unsigned int)");
          }
          if (prVar6->init == (pinit_t)0x0) {
            __assert_fail("info->init != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibrhash/librhash/rhash.c"
                          ,0x99,"rhash rhash_init(unsigned int)");
          }
          *(rhash_hash_info **)&_tail_bit_index[(ulong)id + 3].hash_id = prVar6;
          _tail_bit_index[(ulong)id + 4].msg_size = (unsigned_long_long)local_58;
          local_58 = (uint *)((long)local_58 + (prVar6->context_size + 7 & 0xfffffffffffffff8));
          (*prVar6->init)((void *)_tail_bit_index[(ulong)id + 4].msg_size);
          id = id + 1;
        }
        local_38 = local_38 + 1;
      }
    }
  }
  return _tail_bit_index;
}

Assistant:

RHASH_API rhash rhash_init(unsigned hash_id)
{
	unsigned tail_bit_index; /* index of hash_id trailing bit */
	unsigned num = 0;        /* number of hashes to compute */
	rhash_context_ext *rctx = NULL; /* allocated rhash context */
	size_t hash_size_sum = 0;   /* size of hash contexts to store in rctx */

	unsigned i, bit_index, id;
	struct rhash_hash_info* info;
	size_t aligned_size;
	char* phash_ctx;

	hash_id &= RHASH_ALL_HASHES;
	if (hash_id == 0) {
		errno = EINVAL;
		return NULL;
	}

	tail_bit_index = rhash_ctz(hash_id); /* get trailing bit index */
	assert(tail_bit_index < RHASH_HASH_COUNT);

	id = 1 << tail_bit_index;

	if (hash_id == id) {
		/* handle the most common case of only one hash */
		num = 1;
		info = &rhash_info_table[tail_bit_index];
		hash_size_sum = info->context_size;
	} else {
		/* another case: hash_id contains several hashes */
		for (bit_index = tail_bit_index; id <= hash_id; bit_index++, id = id << 1) {
			assert(id != 0);
			assert(bit_index < RHASH_HASH_COUNT);
			info = &rhash_info_table[bit_index];
			if (hash_id & id) {
				/* align sizes by 8 bytes */
				aligned_size = (info->context_size + 7) & ~7;
				hash_size_sum += aligned_size;
				num++;
			}
		}
		assert(num > 1);
	}

	/* align the size of the rhash context common part */
	aligned_size = (offsetof(rhash_context_ext, vector[num]) + 7) & ~7;
	assert(aligned_size >= sizeof(rhash_context_ext));

	/* allocate rhash context with enough memory to store contexts of all used hashes */
	rctx = (rhash_context_ext*)malloc(aligned_size + hash_size_sum);
	if (rctx == NULL) return NULL;

	/* initialize common fields of the rhash context */
	memset(rctx, 0, sizeof(rhash_context_ext));
	rctx->rc.hash_id = hash_id;
	rctx->flags = RCTX_AUTO_FINAL; /* turn on auto-final by default */
	rctx->state = STATE_ACTIVE;
	rctx->hash_vector_size = num;

	/* aligned hash contexts follows rctx->vector[num] in the same memory block */
	phash_ctx = (char*)rctx + aligned_size;
	assert(phash_ctx >= (char*)&rctx->vector[num]);

	/* initialize context for every hash in a loop */
	for (bit_index = tail_bit_index, id = 1 << tail_bit_index, i = 0;
		id <= hash_id; bit_index++, id = id << 1)
	{
		/* check if a hash function with given id shall be included into rctx */
		if ((hash_id & id) != 0) {
			info = &rhash_info_table[bit_index];
			assert(info->context_size > 0);
			assert(((phash_ctx - (char*)0) & 7) == 0); /* hash context is aligned */
			assert(info->init != NULL);

			rctx->vector[i].hash_info = info;
			rctx->vector[i].context = phash_ctx;

#if 0
			/* BTIH initialization is complex, save pointer for later */
			if ((id & RHASH_BTIH) != 0) rctx->bt_ctx = phash_ctx;
#endif
			phash_ctx += (info->context_size + 7) & ~7;

			/* initialize the i-th hash context */
			info->init(rctx->vector[i].context);
			i++;
		}
	}

	return &rctx->rc; /* return allocated and initialized rhash context */
}